

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)

{
  unqlite_vm *pVm_00;
  unqlite_col **ppuVar1;
  unqlite_vm *pVm;
  unqlite_vm **ppOut_local;
  jx9_vm *pJx9Vm_local;
  unqlite *pDb_local;
  
  *ppOut = (unqlite_vm *)0x0;
  pVm_00 = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,0xf8);
  if (pVm_00 == (unqlite_vm *)0x0) {
    pDb_local._4_4_ = -1;
  }
  else {
    SyZero(pVm_00,0xf8);
    SyMemBackendInitFromParent(&pVm_00->sAlloc,&pDb->sMem);
    ppuVar1 = (unqlite_col **)SyMemBackendAlloc(&pVm_00->sAlloc,0x100);
    pVm_00->apCol = ppuVar1;
    if (pVm_00->apCol == (unqlite_col **)0x0) {
      SyMemBackendRelease(&pVm_00->sAlloc);
      SyMemBackendPoolFree(&pDb->sMem,pVm_00);
      pDb_local._4_4_ = -1;
    }
    else {
      pVm_00->iColSize = 0x20;
      SyZero(pVm_00->apCol,pVm_00->iColSize << 3);
      pVm_00->pJx9Vm = pJx9Vm;
      pVm_00->pDb = pDb;
      if (pDb->pVms == (unqlite_vm *)0x0) {
        pDb->pVms = pVm_00;
      }
      else {
        pVm_00->pNext = pDb->pVms;
        pDb->pVms->pPrev = pVm_00;
        pDb->pVms = pVm_00;
      }
      pDb->iVm = pDb->iVm + 1;
      unqliteRegisterJx9Functions(pVm_00);
      pVm_00->nMagic = 0xea12cd72;
      *ppOut = pVm_00;
      pDb_local._4_4_ = 0;
    }
  }
  return pDb_local._4_4_;
}

Assistant:

static int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)
{
	unqlite_vm *pVm;

	*ppOut = 0;
	/* Allocate a new VM instance */
	pVm = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,sizeof(unqlite_vm));
	if( pVm == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pVm,sizeof(unqlite_vm));
	/* Initialize */
	SyMemBackendInitFromParent(&pVm->sAlloc,&pDb->sMem);
	/* Allocate a new collection table */
	pVm->apCol = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,32 * sizeof(unqlite_col *)); 
	if( pVm->apCol == 0 ){
		goto fail;
	}
	pVm->iColSize = 32; /* Must be a power of two */
	/* Zero the table */
	SyZero((void *)pVm->apCol,pVm->iColSize * sizeof(unqlite_col *));
#if defined(UNQLITE_ENABLE_THREADS)
	if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto fail;
		 }
	 }
#endif
	/* Link the VM to the list of active virtual machines */
	pVm->pJx9Vm = pJx9Vm;
	pVm->pDb = pDb;
	MACRO_LD_PUSH(pDb->pVms,pVm);
	pDb->iVm++;
	/* Register Jx9 functions */
	unqliteRegisterJx9Functions(pVm);
	/* Set the magic number */
	pVm->nMagic = JX9_VM_INIT; /* Same magic number as Jx9 */
	/* All done */
	*ppOut = pVm;
	return UNQLITE_OK;
fail:
	SyMemBackendRelease(&pVm->sAlloc);
	SyMemBackendPoolFree(&pDb->sMem,pVm);
	return UNQLITE_NOMEM;
}